

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O2

int uv__ipv6_link_local_scope_id(void)

{
  int iVar1;
  ifaddrs *local_30;
  ifaddrs *p;
  ifaddrs *ifa;
  sockaddr *psStack_18;
  int rv;
  sockaddr_in6 *a6;
  
  iVar1 = getifaddrs(&p);
  if (iVar1 == 0) {
    local_30 = p;
    while ((local_30 != (ifaddrs *)0x0 &&
           ((local_30->ifa_addr == (sockaddr *)0x0 ||
            (iVar1 = uv__is_ipv6_link_local(local_30->ifa_addr), iVar1 == 0))))) {
      local_30 = local_30->ifa_next;
    }
    ifa._4_4_ = 0;
    if (local_30 != (ifaddrs *)0x0) {
      psStack_18 = local_30->ifa_addr;
      ifa._4_4_ = *(int *)(psStack_18[1].sa_data + 6);
    }
    freeifaddrs(p);
    a6._4_4_ = ifa._4_4_;
  }
  else {
    a6._4_4_ = 0;
  }
  return a6._4_4_;
}

Assistant:

static int uv__ipv6_link_local_scope_id(void) {
  struct sockaddr_in6* a6;
  int rv;
#if defined(_AIX)
  /* AIX & IBM i do not have ifaddrs
   * so fallback to use uv_interface_addresses */
  uv_interface_address_t* interfaces;
  uv_interface_address_t* ifa;
  int count, i;

  if (uv_interface_addresses(&interfaces, &count))
    return 0;

  rv = 0;

  for (ifa = interfaces; ifa != &interfaces[count]; ifa++) {
    if (uv__is_ipv6_link_local((struct sockaddr*) &ifa->address)) {
      rv = ifa->address.address6.sin6_scope_id;
      break;
    }
  }

  uv_free_interface_addresses(interfaces, count);

#else
  struct ifaddrs* ifa;
  struct ifaddrs* p;

  if (getifaddrs(&ifa))
    return 0;

  for (p = ifa; p != NULL; p = p->ifa_next)
    if (p->ifa_addr != NULL)
      if (uv__is_ipv6_link_local(p->ifa_addr))
        break;

  rv = 0;
  if (p != NULL) {
    a6 = (struct sockaddr_in6*) p->ifa_addr;
    rv = a6->sin6_scope_id;
  }

  freeifaddrs(ifa);
#endif /* defined(_AIX) */

  return rv;
}